

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_base_convert(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  int iVar2;
  jx9_value *pjVar3;
  char **in_RCX;
  char *pcVar4;
  jx9_int64 iNum;
  int nLen;
  jx9_real local_38;
  sxu32 local_2c;
  
  if (nArg < 3) {
LAB_0012fe54:
    jx9_value_string(pCtx->pRet,"",0);
  }
  else {
    pjVar3 = apArg[1];
    jx9MemObjToInteger(pjVar3);
    iVar1 = *(int *)&pjVar3->x;
    pjVar3 = apArg[2];
    jx9MemObjToInteger(pjVar3);
    iVar2 = *(int *)&pjVar3->x;
    pjVar3 = *apArg;
    if ((pjVar3->iFlags & 1) == 0) {
      jx9MemObjToInteger(pjVar3);
      local_38 = (pjVar3->x).rVal;
    }
    else {
      pcVar4 = jx9_value_to_string(pjVar3,(int *)&local_2c);
      if ((int)local_2c < 1) goto LAB_0012fe54;
      if (iVar1 == 2) {
        SyBinaryStrToInt64(pcVar4,local_2c,&local_38,in_RCX);
      }
      else if (iVar1 == 8) {
        SyOctalStrToInt64(pcVar4,local_2c,&local_38,in_RCX);
      }
      else if (iVar1 == 0x10) {
        SyHexStrToInt64(pcVar4,local_2c,&local_38,in_RCX);
      }
      else {
        SyStrToInt64(pcVar4,local_2c,&local_38,in_RCX);
      }
    }
    if (iVar2 == 2) {
      pcVar4 = "%qB";
    }
    else if (iVar2 == 8) {
      pcVar4 = "%qo";
    }
    else if (iVar2 == 0x10) {
      pcVar4 = "%qx";
    }
    else {
      pcVar4 = "%qd";
    }
    jx9_result_string_format(pCtx,pcVar4,local_38);
  }
  return 0;
}

Assistant:

static int jx9Builtin_base_convert(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int nLen, iFbase, iTobase;
	const char *zNum;
	jx9_int64 iNum;
	if( nArg < 3 ){
		/* Return the empty string*/
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Base numbers */
	iFbase  = jx9_value_to_int(apArg[1]);
	iTobase = jx9_value_to_int(apArg[2]);
	if( jx9_value_is_string(apArg[0]) ){
		/* Extract the target number */
		zNum = jx9_value_to_string(apArg[0], &nLen);
		if( nLen < 1 ){
			/* Return the empty string*/
			jx9_result_string(pCtx, "", 0);
			return JX9_OK;
		}
		/* Base conversion */
		switch(iFbase){
		case 16:
			/* Hex */
			SyHexStrToInt64(zNum, (sxu32)nLen, (void *)&iNum, 0);
			break;
		case 8:
			/* Octal */
			SyOctalStrToInt64(zNum, (sxu32)nLen, (void *)&iNum, 0);
			break;
		case 2:
			/* Binary */
			SyBinaryStrToInt64(zNum, (sxu32)nLen, (void *)&iNum, 0);
			break;
		default:
			/* Decimal */
			SyStrToInt64(zNum, (sxu32)nLen, (void *)&iNum, 0);
			break;
		}
	}else{
		iNum = jx9_value_to_int64(apArg[0]);
	}
	switch(iTobase){
	case 16:
		/* Hex */
		jx9_result_string_format(pCtx, "%qx", iNum); /* Quad hex */
		break;
	case 8:
		/* Octal */
		jx9_result_string_format(pCtx, "%qo", iNum); /* Quad octal */
		break;
	case 2:
		/* Binary */
		jx9_result_string_format(pCtx, "%qB", iNum); /* Quad binary */
		break;
	default:
		/* Decimal */
		jx9_result_string_format(pCtx, "%qd", iNum); /* Quad decimal */
		break;
	}
	return JX9_OK;
}